

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O0

void grd_flupgrad(grd_st_t *grd_st,seq_t *seq)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint *in_RSI;
  long *in_RDI;
  uint64_t o_1;
  uint32_t n_1;
  double e_1;
  uint32_t y_1;
  uint32_t d;
  uint32_t yp;
  pos_t *pos_1;
  uint32_t t_1;
  uint64_t o;
  uint32_t n;
  double e;
  uint32_t y;
  pos_t *pos;
  uint32_t t;
  double *g;
  double *bnorm;
  double *unorm;
  double_0__0_ *beta;
  double_0__0_ *alpha;
  double_0__0__0_ *psi;
  uint32_t T;
  uint32_t Y;
  mdl_t *mdl;
  uint local_ac;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_84;
  uint local_74;
  uint local_64;
  uint local_54;
  
  lVar7 = *in_RDI;
  uVar5 = *(uint *)(lVar7 + 0xc);
  uVar6 = *in_RSI;
  lVar8 = in_RDI[4];
  lVar9 = in_RDI[9];
  lVar10 = in_RDI[10];
  lVar11 = in_RDI[0xc];
  lVar12 = in_RDI[0xd];
  lVar13 = in_RDI[2];
  for (local_54 = 0; local_54 < uVar6; local_54 = local_54 + 1) {
    for (local_64 = 0; local_64 < uVar5; local_64 = local_64 + 1) {
      dVar1 = *(double *)(lVar9 + (ulong)local_54 * (ulong)uVar5 * 8 + (ulong)local_64 * 8);
      dVar2 = *(double *)(lVar10 + (ulong)local_54 * (ulong)uVar5 * 8 + (ulong)local_64 * 8);
      dVar3 = *(double *)(lVar11 + (ulong)local_54 * 8);
      for (local_74 = 0; local_74 < in_RSI[(ulong)local_54 * 8 + 5]; local_74 = local_74 + 1) {
        atm_inc((double *)
                (lVar13 + *(long *)(*(long *)(lVar7 + 0x28) +
                                   *(long *)(*(long *)(in_RSI + (ulong)local_54 * 8 + 8) +
                                            (ulong)local_74 * 8) * 8) * 8 + (ulong)local_64 * 8),
                dVar1 * dVar2 * dVar3);
      }
    }
  }
  for (local_84 = 1; local_84 < uVar6; local_84 = local_84 + 1) {
    local_98 = 0;
    for (local_94 = 0; local_94 < uVar5; local_94 = local_94 + 1) {
      for (local_9c = 0; local_9c < uVar5; local_9c = local_9c + 1) {
        dVar1 = *(double *)(lVar9 + (ulong)(local_84 - 1) * (ulong)uVar5 * 8 + (ulong)local_94 * 8);
        dVar2 = *(double *)(lVar10 + (ulong)local_84 * (ulong)uVar5 * 8 + (ulong)local_9c * 8);
        dVar3 = *(double *)
                 (lVar8 + (ulong)local_84 * (ulong)uVar5 * (ulong)uVar5 * 8 +
                  (ulong)local_94 * (ulong)uVar5 * 8 + (ulong)local_9c * 8);
        dVar4 = *(double *)(lVar12 + (ulong)local_84 * 8);
        for (local_ac = 0; local_ac < in_RSI[(ulong)local_84 * 8 + 6]; local_ac = local_ac + 1) {
          atm_inc((double *)
                  (lVar13 + *(long *)(*(long *)(lVar7 + 0x30) +
                                     *(long *)(*(long *)(in_RSI + (ulong)local_84 * 8 + 10) +
                                              (ulong)local_ac * 8) * 8) * 8 + (ulong)local_98 * 8),
                  dVar1 * dVar2 * dVar3 * dVar4);
        }
        local_98 = local_98 + 1;
      }
    }
  }
  return;
}

Assistant:

void grd_flupgrad(grd_st_t *grd_st, const seq_t *seq) {
	const mdl_t *mdl = grd_st->mdl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t T = seq->len;
	const double (*psi  )[T][Y][Y] = (void *)grd_st->psi;
	const double (*alpha)[T][Y]    = (void *)grd_st->alpha;
	const double (*beta )[T][Y]    = (void *)grd_st->beta;
	const double  *unorm           =         grd_st->unorm;
	const double  *bnorm           =         grd_st->bnorm;
	double *g = grd_st->g;
	for (uint32_t t = 0; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t y = 0; y < Y; y++) {
			double e = (*alpha)[t][y] * (*beta)[t][y] * unorm[t];
			for (uint32_t n = 0; n < pos->ucnt; n++) {
				const uint64_t o = pos->uobs[n];
				atm_inc(g + mdl->uoff[o] + y, e);
			}
		}
	}
	for (uint32_t t = 1; t < T; t++) {
		const pos_t *pos = &(seq->pos[t]);
		for (uint32_t yp = 0, d = 0; yp < Y; yp++) {
			for (uint32_t y = 0; y < Y; y++, d++) {
				double e = (*alpha)[t - 1][yp] * (*beta)[t][y]
				         * (*psi)[t][yp][y] * bnorm[t];
				for (uint32_t n = 0; n < pos->bcnt; n++) {
					const uint64_t o = pos->bobs[n];
					atm_inc(g + mdl->boff[o] + d, e);
				}
			}
		}
	}
}